

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void KINPrintInfo(KINMem kin_mem,int info_code,char *module,char *fname,char *msgfmt,...)

{
  char in_AL;
  undefined8 uVar1;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char retstr [30];
  va_list ap;
  char msg1 [40];
  char msg [256];
  undefined8 local_228;
  char acStack_220 [9];
  undefined2 uStack_217;
  undefined1 uStack_215;
  undefined2 uStack_214;
  undefined1 uStack_212;
  undefined1 uStack_211;
  undefined1 uStack_210;
  undefined8 local_208;
  char *local_200;
  undefined1 *local_1f8;
  char local_1e8 [48];
  undefined1 local_1b8 [40];
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  char local_108 [256];
  
  local_1f8 = local_1b8;
  if (in_AL != '\0') {
    local_188 = in_XMM0_Da;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_208 = 0x3000000028;
  local_200 = retstr + 8;
  local_190 = in_R9;
  if (info_code != 1) {
    vsnprintf(local_108,0x100,msgfmt,&local_208);
    return;
  }
  local_208 = 0x3000000030;
  switch((undefined4)local_190) {
  case 0:
    local_228 = 0x434355535f4e494b;
    builtin_strncpy(acStack_220,"ESS",4);
    break;
  case 2:
    local_228 = 0x504554535f4e494b;
    builtin_strncpy(acStack_220,"_LT_STPTO",9);
    uStack_217 = 0x4c;
    break;
  case 0xfffffff1:
    local_228 = 0x545045525f4e494b;
    builtin_strncpy(acStack_220,"D_SYSF",6);
    uVar1 = 0x5252455f434e55;
    goto LAB_0010c0de;
  case 0xfffffff3:
    local_228 = 0x465359535f4e494b;
    builtin_strncpy(acStack_220,"UNC_FAIL",9);
    break;
  case 0xfffffff4:
    builtin_strncpy(acStack_220,"ONDSOLVE_",9);
    uStack_217 = 0x4146;
    uStack_215 = 0x49;
    uStack_214 = 0x554c;
    uStack_212 = 0x52;
    uStack_211 = 0x45;
    uStack_210 = 0;
    local_228 = 0x434552505f4e494b;
    break;
  case 0xfffffff5:
    local_228 = 0x434552505f4e494b;
    builtin_strncpy(acStack_220,"ONDSET_",7);
    uVar1 = 0x4552554c494146;
    goto LAB_0010c186;
  case 0xfffffff7:
    local_228 = 0x534e494c5f4e494b;
    builtin_strncpy(acStack_220,"OLV_NO_RE",9);
    uStack_217 = 0x4f43;
    uStack_215 = 0x56;
    uStack_214 = 0x5245;
    uStack_212 = 0x59;
    uStack_211 = 0;
    break;
  case 0xfffffff8:
    local_228 = 0x454e494c5f4e494b;
    builtin_strncpy(acStack_220,"SEARCH",6);
    uVar1 = 0x4c49414643425f;
LAB_0010c0de:
    acStack_220[6] = (char)uVar1;
    acStack_220[7] = (char)((ulong)uVar1 >> 8);
    acStack_220[8] = (char)((ulong)uVar1 >> 0x10);
    uStack_217 = (undefined2)((ulong)uVar1 >> 0x18);
    uStack_215 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_214 = (undefined2)((ulong)uVar1 >> 0x30);
    break;
  case 0xfffffff9:
    local_228 = 0x454e584d5f4e494b;
    builtin_strncpy(acStack_220,"WT_5X_E",7);
    uVar1 = 0x44454445454358;
    goto LAB_0010c186;
  case 0xfffffffa:
    local_228 = 0x4958414d5f4e494b;
    builtin_strncpy(acStack_220,"TER_REACH",9);
    uStack_217 = 0x4445;
    uStack_215 = 0;
    break;
  case 0xfffffffb:
    local_228 = 0x454e494c5f4e494b;
    builtin_strncpy(acStack_220,"SEARCH_",7);
    uVar1 = 0x564e4f434e4f4e;
LAB_0010c186:
    acStack_220[7] = (char)uVar1;
    acStack_220[8] = (char)((ulong)uVar1 >> 8);
    uStack_217 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_215 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_214 = (undefined2)((ulong)uVar1 >> 0x28);
    uStack_212 = 0;
  }
  sprintf(local_1e8,msgfmt);
  sprintf(local_108,"%s (%s)",local_1e8,&local_228);
  return;
}

Assistant:

void KINPrintInfo(SUNDIALS_MAYBE_UNUSED KINMem kin_mem, int info_code,
                  SUNDIALS_MAYBE_UNUSED const char* module,
                  SUNDIALS_MAYBE_UNUSED const char* fname, const char* msgfmt,
                  ...)
{
  va_list ap;
  char msg[256], msg1[40];
  char retstr[30];
  int ret;

  /* Initialize argument processing
   (msgfrmt is the last required argument) */

  va_start(ap, msgfmt);

  if (info_code == PRNT_RETVAL)
  {
    /* If info_code = PRNT_RETVAL, decode the numeric value */

    ret = va_arg(ap, int);

    switch (ret)
    {
    case KIN_SUCCESS: sprintf(retstr, "KIN_SUCCESS"); break;
    case KIN_SYSFUNC_FAIL: sprintf(retstr, "KIN_SYSFUNC_FAIL"); break;
    case KIN_REPTD_SYSFUNC_ERR: sprintf(retstr, "KIN_REPTD_SYSFUNC_ERR"); break;
    case KIN_STEP_LT_STPTOL: sprintf(retstr, "KIN_STEP_LT_STPTOL"); break;
    case KIN_LINESEARCH_NONCONV:
      sprintf(retstr, "KIN_LINESEARCH_NONCONV");
      break;
    case KIN_LINESEARCH_BCFAIL: sprintf(retstr, "KIN_LINESEARCH_BCFAIL"); break;
    case KIN_MAXITER_REACHED: sprintf(retstr, "KIN_MAXITER_REACHED"); break;
    case KIN_MXNEWT_5X_EXCEEDED:
      sprintf(retstr, "KIN_MXNEWT_5X_EXCEEDED");
      break;
    case KIN_LINSOLV_NO_RECOVERY:
      sprintf(retstr, "KIN_LINSOLV_NO_RECOVERY");
      break;
    case KIN_LSETUP_FAIL: sprintf(retstr, "KIN_PRECONDSET_FAILURE"); break;
    case KIN_LSOLVE_FAIL: sprintf(retstr, "KIN_PRECONDSOLVE_FAILURE"); break;
    }

    /* Compose the message */

    sprintf(msg1, msgfmt, ret);
    sprintf(msg, "%s (%s)", msg1, retstr);
  }
  else
  {
    /* Compose the message */

    vsnprintf(msg, sizeof msg, msgfmt, ap);
  }

  SUNLogInfo(KIN_LOGGER, "KINSOL", fname, "%s", msg);

  /* finalize argument processing */

  va_end(ap);

  return;
}